

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvereal.hpp
# Opt level: O0

void __thiscall soplex::SoPlexBase<double>::_loadRealLP(SoPlexBase<double> *this,bool initBasis)

{
  byte initSlackBasis;
  byte in_SIL;
  EVP_PKEY_CTX *ctx;
  SPxLPBase<double> *in_RDI;
  SPxSolverBase<double> *unaff_retaddr;
  
  initSlackBasis = in_SIL & 1;
  ctx = (EVP_PKEY_CTX *)in_RDI[0x10].super_LPRowSetBase<double>.super_SVSetBase<double>.factor;
  SPxSolverBase<double>::loadLP(unaff_retaddr,in_RDI,(bool)initSlackBasis);
  *(undefined1 *)&in_RDI[0x25].thesense = MAXIMIZE;
  (*(code *)**(undefined8 **)in_RDI[0x10].super_LPRowSetBase<double>.super_SVSetBase<double>.factor)
            ();
  spx_free<soplex::SPxLPBase<double>*>((SPxLPBase<double> **)0x45c4f1);
  in_RDI[0x10].super_LPRowSetBase<double>.super_SVSetBase<double>.factor =
       (double)&(in_RDI->super_LPColSetBase<double>).scaleExp.data;
  if ((initSlackBasis & 1) != 0) {
    SPxSolverBase<double>::init
              ((SPxSolverBase<double> *)&(in_RDI->super_LPColSetBase<double>).scaleExp.data,ctx);
  }
  return;
}

Assistant:

void SoPlexBase<R>::_loadRealLP(bool initBasis)
{
   _solver.loadLP(*_realLP, initBasis);
   _isRealLPLoaded = true;
   _realLP->~SPxLPBase<R>();
   spx_free(_realLP);
   _realLP = &_solver;

   if(initBasis)
      _solver.init();
}